

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
emplaceRealloc<slang::ast::PortSymbol::NetTypeRange>
          (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this,pointer pos,
          NetTypeRange *args)

{
  ulong uVar1;
  pointer p;
  undefined8 uVar2;
  bitwidth_t bVar3;
  undefined4 uVar4;
  pointer pNVar5;
  pointer pNVar6;
  pointer pNVar7;
  long lVar8;
  long lVar9;
  size_type sVar10;
  ulong uVar11;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar1 = this->cap;
  if (uVar11 < uVar1 * 2) {
    uVar11 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar11 = 0x7ffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  pNVar5 = (pointer)operator_new(uVar11 << 4);
  uVar2 = *(undefined8 *)&args->width;
  *(undefined8 *)((long)pNVar5 + lVar9) = args->netType;
  ((undefined8 *)((long)pNVar5 + lVar9))[1] = uVar2;
  p = this->data_;
  sVar10 = this->len;
  lVar8 = (long)p + (sVar10 * 0x10 - (long)pos);
  pNVar6 = p;
  pNVar7 = pNVar5;
  if (lVar8 == 0) {
    pNVar6 = pNVar5;
    pNVar7 = p;
    if (sVar10 != 0) {
      do {
        bVar3 = pNVar7->width;
        uVar4 = *(undefined4 *)&pNVar7->field_0xc;
        pNVar6->netType = pNVar7->netType;
        pNVar6->width = bVar3;
        *(undefined4 *)&pNVar6->field_0xc = uVar4;
        pNVar7 = pNVar7 + 1;
        pNVar6 = pNVar6 + 1;
      } while (pNVar7 != pos);
    }
  }
  else {
    for (; pNVar6 != pos; pNVar6 = pNVar6 + 1) {
      bVar3 = pNVar6->width;
      uVar4 = *(undefined4 *)&pNVar6->field_0xc;
      pNVar7->netType = pNVar6->netType;
      pNVar7->width = bVar3;
      *(undefined4 *)&pNVar7->field_0xc = uVar4;
      pNVar7 = pNVar7 + 1;
    }
    memcpy((void *)((long)pNVar5 + lVar9 + 0x10),pos,(lVar8 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar10 = this->len;
  }
  this->len = sVar10 + 1;
  this->cap = uVar11;
  this->data_ = pNVar5;
  return (pointer)((long)pNVar5 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}